

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O2

double __thiscall soplex::SPxSolverBase<double>::nonbasicValue(SPxSolverBase<double> *this)

{
  Status SVar1;
  Status *pSVar2;
  pointer pdVar3;
  ulong uVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  long lVar8;
  pointer pdVar9;
  pointer pdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  if (this->m_nonbasicValueUpToDate == true) {
    return this->m_nonbasicValue;
  }
  if (this->theRep == COLUMN) {
    uVar4 = (ulong)(uint)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                         super_SVSetBase<double>.set.thenum;
    pSVar2 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
    pdVar3 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    if (this->theType == LEAVE) {
      pdVar7 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      dVar12 = 0.0;
      dVar11 = 0.0;
      while (0 < (int)uVar4) {
        SVar1 = pSVar2[uVar4 - 1];
        uVar4 = uVar4 - 1;
        pdVar5 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar9 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (((SVar1 == P_ON_UPPER) ||
            (pdVar5 = pdVar7,
            pdVar9 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start, SVar1 == P_ON_LOWER)) ||
           (pdVar9 = pdVar3, SVar1 == P_FIXED)) {
          dVar13 = dVar11 + pdVar9[uVar4] * pdVar5[uVar4];
          dVar12 = dVar12 + (pdVar9[uVar4] * pdVar5[uVar4] - (dVar13 - dVar11)) +
                            (dVar11 - (dVar13 - (dVar13 - dVar11)));
          dVar11 = dVar13;
        }
      }
      uVar4 = (ulong)(uint)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                           super_SVSetBase<double>.set.thenum;
      pdVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      while (0 < (int)uVar4) {
        SVar1 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[uVar4 - 1];
        uVar4 = uVar4 - 1;
        pdVar7 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar5 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (((SVar1 == P_ON_UPPER) ||
            (pdVar7 = pdVar3,
            pdVar5 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start, SVar1 == P_ON_LOWER)) ||
           (pdVar5 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start, SVar1 == P_FIXED)) {
          dVar13 = dVar11 + pdVar5[uVar4] * pdVar7[uVar4];
          dVar12 = dVar12 + (pdVar5[uVar4] * pdVar7[uVar4] - (dVar13 - dVar11)) +
                            (dVar11 - (dVar13 - (dVar13 - dVar11)));
          dVar11 = dVar13;
        }
      }
    }
    else {
      pdVar7 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar12 = 0.0;
      dVar11 = 0.0;
      while (0 < (int)uVar4) {
        SVar1 = pSVar2[uVar4 - 1];
        uVar4 = uVar4 - 1;
        pdVar5 = pdVar7;
        if (((SVar1 == P_FIXED) || (SVar1 == P_ON_LOWER)) ||
           (pdVar5 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start, SVar1 == P_ON_UPPER)) {
          dVar13 = pdVar3[uVar4] * pdVar5[uVar4];
          dVar14 = dVar11 + dVar13;
          dVar12 = dVar12 + (dVar13 - (dVar14 - dVar11)) + (dVar11 - (dVar14 - (dVar14 - dVar11)));
          dVar11 = dVar14;
        }
      }
      uVar4 = (ulong)(uint)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                           super_SVSetBase<double>.set.thenum;
      pdVar3 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      while (0 < (int)uVar4) {
        SVar1 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[uVar4 - 1];
        uVar4 = uVar4 - 1;
        pdVar7 = pdVar3;
        if (((SVar1 == P_FIXED) || (SVar1 == P_ON_LOWER)) ||
           (pdVar7 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start, SVar1 == P_ON_UPPER)) {
          dVar13 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4] * pdVar7[uVar4];
          dVar14 = dVar11 + dVar13;
          dVar12 = dVar12 + (dVar13 - (dVar14 - dVar11)) + (dVar11 - (dVar14 - (dVar14 - dVar11)));
          dVar11 = dVar14;
        }
      }
    }
LAB_0019e15e:
    this->m_nonbasicValue = dVar11 + dVar12;
    this->m_nonbasicValueUpToDate = true;
    return dVar11 + dVar12;
  }
  uVar4 = (ulong)(uint)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                       super_SVSetBase<double>.set.thenum;
  pdVar3 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar5 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  dVar12 = 0.0;
  dVar11 = 0.0;
LAB_0019de1a:
  lVar8 = 0;
  while (0 < (int)uVar4 + (int)lVar8) {
    SVar1 = (this->super_SPxBasisBase<double>).thedesc.colstat.data[uVar4 + lVar8 + -1];
    lVar8 = lVar8 + -1;
    pdVar6 = pdVar9;
    pdVar10 = pdVar5;
    if ((SVar1 == D_ON_UPPER) || (pdVar6 = pdVar7, pdVar10 = pdVar3, SVar1 == D_ON_LOWER))
    goto LAB_0019de99;
    if (SVar1 == D_ON_BOTH) goto code_r0x0019de43;
  }
  uVar4 = (ulong)(uint)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                       super_SVSetBase<double>.set.thenum;
  pdVar3 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar5 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
LAB_0019df08:
  lVar8 = 0;
  while (0 < (int)uVar4 + (int)lVar8) {
    SVar1 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[uVar4 + lVar8 + -1];
    lVar8 = lVar8 + -1;
    pdVar6 = pdVar9;
    pdVar10 = pdVar5;
    if ((SVar1 == D_ON_UPPER) || (pdVar6 = pdVar7, pdVar10 = pdVar3, SVar1 == D_ON_LOWER))
    goto LAB_0019df87;
    if (SVar1 == D_ON_BOTH) goto code_r0x0019df31;
  }
  goto LAB_0019e15e;
code_r0x0019df31:
  dVar13 = pdVar3[uVar4 + lVar8] * pdVar7[uVar4 + lVar8];
  dVar14 = dVar11 + dVar13;
  dVar12 = dVar12 + (dVar13 - (dVar14 - dVar11)) + (dVar11 - (dVar14 - (dVar14 - dVar11)));
  pdVar6 = pdVar9;
  pdVar10 = pdVar5;
  dVar11 = dVar14;
LAB_0019df87:
  dVar13 = dVar11 + pdVar10[uVar4 + lVar8] * pdVar6[uVar4 + lVar8];
  dVar12 = dVar12 + (pdVar10[uVar4 + lVar8] * pdVar6[uVar4 + lVar8] - (dVar13 - dVar11)) +
                    (dVar11 - (dVar13 - (dVar13 - dVar11)));
  uVar4 = uVar4 + lVar8;
  dVar11 = dVar13;
  goto LAB_0019df08;
code_r0x0019de43:
  dVar13 = pdVar3[uVar4 + lVar8] * pdVar7[uVar4 + lVar8];
  dVar14 = dVar11 + dVar13;
  dVar12 = dVar12 + (dVar13 - (dVar14 - dVar11)) + (dVar11 - (dVar14 - (dVar14 - dVar11)));
  pdVar6 = pdVar9;
  pdVar10 = pdVar5;
  dVar11 = dVar14;
LAB_0019de99:
  dVar13 = dVar11 + pdVar10[uVar4 + lVar8] * pdVar6[uVar4 + lVar8];
  dVar12 = dVar12 + (pdVar10[uVar4 + lVar8] * pdVar6[uVar4 + lVar8] - (dVar13 - dVar11)) +
                    (dVar11 - (dVar13 - (dVar13 - dVar11)));
  uVar4 = uVar4 + lVar8;
  dVar11 = dVar13;
  goto LAB_0019de1a;
}

Assistant:

R SPxSolverBase<R>::nonbasicValue()
   {
      int i;
      StableSum<R> val;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

#ifndef ENABLE_ADDITIONAL_CHECKS

      // if the value is available we don't need to recompute it
      if(m_nonbasicValueUpToDate)
         return m_nonbasicValue;

#endif

      if(rep() == COLUMN)
      {
         if(type() == LEAVE)
         {
            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theUCbound[i] * SPxLPBase<R>::upper(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::upper(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theLCbound[i] * SPxLPBase<R>::lower(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lower(i), SPxLPBase<R>::upper(i), this->epsilon()));
                  val += this->maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theLRbound[i] * SPxLPBase<R>::rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theURbound[i] * SPxLPBase<R>::lhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lhs(i), SPxLPBase<R>::rhs(i), this->epsilon()));
                  val += this->maxRowObj(i) * SPxLPBase<R>::lhs(i);
                  break;

               default:
                  break;
               }
            }
         }
         else
         {
            assert(type() == ENTER);

            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxObj(i) * theUCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLCbound[i], theUCbound[i], this->epsilon()));
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxRowObj(i) * theLRbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLRbound[i], theURbound[i], this->epsilon()));
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               default:
                  break;
               }
            }
         }
      }
      else
      {
         assert(rep() == ROW);
         assert(type() == ENTER);

         for(i = this->nCols() - 1; i >= 0; --i)
         {
            switch(ds.colStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theUCbound[i] * this->lower(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLCbound[i] * this->upper(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLCbound[i] * this->upper(i);
               val += theUCbound[i] * this->lower(i);
               break;

            default:
               break;
            }
         }

         for(i = this->nRows() - 1; i >= 0; --i)
         {
            switch(ds.rowStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theURbound[i] * this->lhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLRbound[i] * this->rhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLRbound[i] * this->rhs(i);
               val += theURbound[i] * this->lhs(i);
               break;

            default:
               break;
            }
         }
      }

#ifdef ENABLE_ADDITIONAL_CHECKS

      if(m_nonbasicValueUpToDate && NE(m_nonbasicValue, val))
      {
         SPX_MSG_ERROR(std::cerr << "stored nonbasic value: " << m_nonbasicValue
                       << ", correct nonbasic value: " << val
                       << ", violation: " << val - m_nonbasicValue << std::endl;)
         assert(EQrel(m_nonbasicValue, val, 1e-12));
      }

#endif

      if(!m_nonbasicValueUpToDate)
      {
         m_nonbasicValue = R(val);
         m_nonbasicValueUpToDate = true;
      }

      return val;
   }